

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void ps_parser_to_token(PS_Parser parser,T1_Token token)

{
  FT_Byte FVar1;
  FT_Byte *limit;
  int iVar2;
  FT_Byte *pFVar3;
  FT_Byte *local_28;
  
  token->start = (FT_Byte *)0x0;
  token->limit = (FT_Byte *)0x0;
  token->type = T1_TOKEN_TYPE_NONE;
  ps_parser_skip_spaces(parser);
  local_28 = parser->cursor;
  limit = parser->limit;
  if (limit <= local_28) {
    return;
  }
  FVar1 = *local_28;
  if (FVar1 == '{') {
    token->type = T1_TOKEN_TYPE_ARRAY;
    token->start = local_28;
    iVar2 = skip_procedure(&local_28,limit);
    pFVar3 = local_28;
joined_r0x001f1846:
    if (iVar2 == 0) {
      token->limit = pFVar3;
      local_28 = pFVar3;
      goto LAB_001f1885;
    }
  }
  else {
    if (FVar1 != '[') {
      if (FVar1 == '(') {
        token->type = T1_TOKEN_TYPE_STRING;
        token->start = local_28;
        iVar2 = skip_literal_string(&local_28,limit);
        pFVar3 = local_28;
      }
      else {
        token->start = local_28;
        token->type = (uint)(*local_28 == '/') * 3 + T1_TOKEN_TYPE_ANY;
        ps_parser_skip_PS_token(parser);
        iVar2 = parser->error;
        pFVar3 = parser->cursor;
      }
      goto joined_r0x001f1846;
    }
    token->type = T1_TOKEN_TYPE_ARRAY;
    token->start = local_28;
    parser->cursor = local_28 + 1;
    ps_parser_skip_spaces(parser);
    iVar2 = 1;
    while ((pFVar3 = parser->cursor, pFVar3 < limit && (parser->error == 0))) {
      if (*pFVar3 == ']') {
        if (iVar2 < 2) {
          local_28 = pFVar3 + 1;
          token->limit = local_28;
          goto LAB_001f1893;
        }
        iVar2 = iVar2 + -1;
      }
      else if (*pFVar3 == '[') {
        iVar2 = iVar2 + 1;
      }
      ps_parser_skip_PS_token(parser);
      ps_parser_skip_spaces(parser);
    }
  }
  local_28 = pFVar3;
  pFVar3 = token->limit;
LAB_001f1885:
  if (pFVar3 == (FT_Byte *)0x0) {
    token->start = (FT_Byte *)0x0;
    token->type = T1_TOKEN_TYPE_NONE;
  }
LAB_001f1893:
  parser->cursor = local_28;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_to_token( PS_Parser  parser,
                      T1_Token   token )
  {
    FT_Byte*  cur;
    FT_Byte*  limit;
    FT_Int    embed;


    token->type  = T1_TOKEN_TYPE_NONE;
    token->start = NULL;
    token->limit = NULL;

    /* first of all, skip leading whitespace */
    ps_parser_skip_spaces( parser );

    cur   = parser->cursor;
    limit = parser->limit;

    if ( cur >= limit )
      return;

    switch ( *cur )
    {
      /************* check for literal string *****************/
    case '(':
      token->type  = T1_TOKEN_TYPE_STRING;
      token->start = cur;

      if ( skip_literal_string( &cur, limit ) == FT_Err_Ok )
        token->limit = cur;
      break;

      /************* check for programs/array *****************/
    case '{':
      token->type  = T1_TOKEN_TYPE_ARRAY;
      token->start = cur;

      if ( skip_procedure( &cur, limit ) == FT_Err_Ok )
        token->limit = cur;
      break;

      /************* check for table/array ********************/
      /* XXX: in theory we should also look for "<<"          */
      /*      since this is semantically equivalent to "[";   */
      /*      in practice it doesn't matter (?)               */
    case '[':
      token->type  = T1_TOKEN_TYPE_ARRAY;
      embed        = 1;
      token->start = cur++;

      /* we need this to catch `[ ]' */
      parser->cursor = cur;
      ps_parser_skip_spaces( parser );
      cur = parser->cursor;

      while ( cur < limit && !parser->error )
      {
        /* XXX: this is wrong because it does not      */
        /*      skip comments, procedures, and strings */
        if ( *cur == '[' )
          embed++;
        else if ( *cur == ']' )
        {
          embed--;
          if ( embed <= 0 )
          {
            token->limit = ++cur;
            break;
          }
        }

        parser->cursor = cur;
        ps_parser_skip_PS_token( parser );
        /* we need this to catch `[XXX ]' */
        ps_parser_skip_spaces  ( parser );
        cur = parser->cursor;
      }
      break;

      /* ************ otherwise, it is any token **************/
    default:
      token->start = cur;
      token->type  = ( *cur == '/' ) ? T1_TOKEN_TYPE_KEY : T1_TOKEN_TYPE_ANY;
      ps_parser_skip_PS_token( parser );
      cur = parser->cursor;
      if ( !parser->error )
        token->limit = cur;
    }

    if ( !token->limit )
    {
      token->start = NULL;
      token->type  = T1_TOKEN_TYPE_NONE;
    }

    parser->cursor = cur;
  }